

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

void qpdf_register_progress_reporter
               (qpdf_data qpdf,_func_void_int_void_ptr *report_progress,void *data)

{
  QPDFWriter *this;
  FunctionProgressReporter *this_00;
  shared_ptr<QPDFWriter::ProgressReporter> local_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this = (qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (FunctionProgressReporter *)operator_new(0x28);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x10);
  *(_func_void_int_void_ptr **)local_48._M_unused._0_8_ = report_progress;
  *(void **)((long)local_48._M_unused._0_8_ + 8) = data;
  pcStack_30 = std::
               _Function_handler<void_(int),_std::_Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(int),_std::_Bind<void_(*(std::_Placeholder<1>,_void_*))(int,_void_*)>_>
             ::_M_manager;
  QPDFWriter::FunctionProgressReporter::FunctionProgressReporter
            (this_00,(function<void_(int)> *)&local_48);
  local_58.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFWriter::FunctionProgressReporter*>
            (&local_58.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  QPDFWriter::registerProgressReporter(this,&local_58);
  if (local_58.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<QPDFWriter::ProgressReporter,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdf_register_progress_reporter(
    qpdf_data qpdf, void (*report_progress)(int percent, void* data), void* data)
{
    QTC::TC("qpdf", "qpdf-c registered progress reporter");
    qpdf->qpdf_writer->registerProgressReporter(
        std::shared_ptr<QPDFWriter::ProgressReporter>(new QPDFWriter::FunctionProgressReporter(
            std::bind(report_progress, std::placeholders::_1, data))));
}